

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

Tagger * MeCab::createTagger(char *argv)

{
  uint uVar1;
  int __oflag;
  char *in_RDI;
  TaggerImpl *tagger;
  TaggerImpl *in_stack_ffffffffffffffe0;
  TaggerImpl *local_8;
  
  local_8 = (TaggerImpl *)operator_new(0x60);
  anon_unknown_0::TaggerImpl::TaggerImpl(in_stack_ffffffffffffffe0);
  uVar1 = anon_unknown_0::TaggerImpl::open(local_8,in_RDI,__oflag);
  if ((uVar1 & 1) == 0) {
    (*(local_8->super_Tagger)._vptr_Tagger[0x1b])();
    setGlobalError((char *)0x19f308);
    if (local_8 != (TaggerImpl *)0x0) {
      (*(local_8->super_Tagger)._vptr_Tagger[0x1d])();
    }
    local_8 = (TaggerImpl *)0x0;
  }
  return &local_8->super_Tagger;
}

Assistant:

Tagger *createTagger(const char *argv) {
  TaggerImpl *tagger = new TaggerImpl();
  if (!tagger->open(argv)) {
    setGlobalError(tagger->what());
    delete tagger;
    return 0;
  }
  return tagger;
}